

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::get_bit(Arithmetic_Codec *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = this->value;
  uVar5 = this->length;
  uVar3 = uVar5 >> 1;
  this->length = uVar3;
  uVar2 = uVar1;
  if (uVar3 <= uVar1) {
    this->value = uVar1 - uVar3;
    uVar2 = uVar1 - uVar3;
  }
  if (uVar5 < 0x2000000) {
    pbVar4 = this->ac_pointer;
    uVar5 = uVar3;
    do {
      pbVar4 = pbVar4 + 1;
      this->ac_pointer = pbVar4;
      uVar2 = uVar2 << 8 | (uint)*pbVar4;
      this->value = uVar2;
      this->length = uVar5 << 8;
      bVar6 = uVar5 < 0x10000;
      uVar5 = uVar5 << 8;
    } while (bVar6);
  }
  return (uint)(uVar3 <= uVar1);
}

Assistant:

unsigned Arithmetic_Codec::get_bit(void)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      unsigned bit = (value >= length);                              // decode bit
      if (bit) value -= length;                                       // move base

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }